

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

cmFileLockResult __thiscall
cmFileLockPool::ScopePool::Lock(ScopePool *this,string *filename,unsigned_long timeoutSec)

{
  bool bVar1;
  cmFileLock *this_00;
  cmFileLockResult result;
  cmFileLock *lock;
  
  this_00 = (cmFileLock *)operator_new(0x28);
  cmFileLock::cmFileLock(this_00);
  lock = this_00;
  result = cmFileLock::Lock(this_00,filename,timeoutSec);
  bVar1 = cmFileLockResult::IsOk(&result);
  if (bVar1) {
    std::__cxx11::list<cmFileLock_*,_std::allocator<cmFileLock_*>_>::push_back(&this->Locks,&lock);
    result = cmFileLockResult::MakeOk();
  }
  else {
    cmFileLock::~cmFileLock(this_00);
    operator_delete(this_00,0x28);
  }
  return result;
}

Assistant:

cmFileLockResult cmFileLockPool::ScopePool::Lock(
    const std::string& filename, unsigned long timeoutSec)
{
  cmFileLock *lock = new cmFileLock();
  const cmFileLockResult result = lock->Lock(filename, timeoutSec);
  if (result.IsOk())
    {
    this->Locks.push_back(lock);
    return cmFileLockResult::MakeOk();
    }
  else
    {
    delete lock;
    return result;
    }
}